

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_date(archive *_a,wchar_t flag,char *datestr)

{
  wchar_t r;
  char *datestr_local;
  wchar_t flag_local;
  archive *_a_local;
  
  _a_local._4_4_ = validate_time_flag(_a,flag,"archive_match_include_date");
  if (_a_local._4_4_ == L'\0') {
    _a_local._4_4_ = set_timefilter_date((archive_match *)_a,flag,datestr);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_include_date(struct archive *_a, int flag,
    const char *datestr)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_date");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_date((struct archive_match *)_a, flag, datestr);
}